

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngtexture.cpp
# Opt level: O0

FTexture * PNGTexture_CreateFromFile(PNGHandle *png,FString *filename)

{
  FString *filename_00;
  uint uVar1;
  int width_00;
  int height_00;
  FileReader *pFVar2;
  FPNGTexture *this;
  byte local_2d;
  BYTE local_2c;
  BYTE local_2b;
  byte local_2a;
  byte local_29;
  int iStack_28;
  BYTE interlace;
  BYTE filter;
  BYTE compression;
  BYTE colortype;
  BYTE bitdepth;
  DWORD height;
  DWORD width;
  FString *filename_local;
  PNGHandle *png_local;
  
  _height = filename;
  filename_local = (FString *)png;
  uVar1 = M_FindPNGChunk(png,0x52444849);
  if (uVar1 == 0) {
    png_local = (PNGHandle *)0x0;
  }
  else {
    (**(code **)(*(long *)filename_local->Chars + 0x10))(filename_local->Chars,&filter,4);
    (**(code **)(*(long *)filename_local->Chars + 0x10))
              (filename_local->Chars,&stack0xffffffffffffffd8,4);
    pFVar2 = FileReader::operator>>((FileReader *)filename_local->Chars,&local_29);
    pFVar2 = FileReader::operator>>(pFVar2,&local_2a);
    pFVar2 = FileReader::operator>>(pFVar2,&local_2b);
    pFVar2 = FileReader::operator>>(pFVar2,&local_2c);
    FileReader::operator>>(pFVar2,&local_2d);
    if (((local_2b == '\0') && (local_2c == '\0')) && (local_2d < 2)) {
      if ((1 << (local_2a & 0x1f) & 0x5dU) == 0) {
        png_local = (PNGHandle *)0x0;
      }
      else if ((1 << (local_29 & 0x1f) & 0x116U) == 0) {
        png_local = (PNGHandle *)0x0;
      }
      else {
        this = (FPNGTexture *)operator_new(0xd0);
        filename_00 = _height;
        pFVar2 = (FileReader *)filename_local->Chars;
        width_00 = BigLong(_filter);
        height_00 = BigLong(iStack_28);
        FPNGTexture::FPNGTexture
                  (this,pFVar2,-1,filename_00,width_00,height_00,local_29,local_2a,local_2d);
        png_local = (PNGHandle *)this;
      }
    }
    else {
      png_local = (PNGHandle *)0x0;
    }
  }
  return (FTexture *)png_local;
}

Assistant:

FTexture *PNGTexture_CreateFromFile(PNGHandle *png, const FString &filename)
{
	DWORD width, height;
	BYTE bitdepth, colortype, compression, filter, interlace;

	if (M_FindPNGChunk(png, MAKE_ID('I','H','D','R')) == 0)
	{
		return NULL;
	}

	// Check the IHDR to make sure it's a type of PNG we support.
	png->File->Read(&width, 4);
	png->File->Read(&height, 4);
	(*png->File) >> bitdepth >> colortype >> compression >> filter >> interlace;

	if (compression != 0 || filter != 0 || interlace > 1)
	{
		return NULL;
	}
	if (!((1 << colortype) & 0x5D))
	{
		return NULL;
	}
	if (!((1 << bitdepth) & 0x116))
	{
		return NULL;
	}

	return new FPNGTexture (*png->File, -1, filename, BigLong((int)width), BigLong((int)height),
		bitdepth, colortype, interlace);
}